

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O2

void gola_fixup(LexState *ls,FuncScope *bl)

{
  uint8_t *puVar1;
  uint uVar2;
  VarInfo *pVVar3;
  uint64_t uVar4;
  VarInfo *vg;
  VarInfo *vl;
  VarInfo *local_38;
  
  pVVar3 = ls->vstack;
  vl = pVVar3 + bl->vstart;
  uVar2 = ls->vtop;
  local_38 = pVVar3 + bl->vstart;
  do {
    local_38 = local_38 + 1;
    if (pVVar3 + uVar2 <= vl) {
      return;
    }
    uVar4 = (vl->name).gcptr64;
    if (uVar4 != 0) {
      if ((vl->info & 4) == 0) {
        if ((vl->info & 2) != 0) {
          if (bl->prev == (FuncScope *)0x0) {
            ls->linenumber = ls->fs->bcbase[vl->startpc].line;
            if (uVar4 == 1) {
              lj_lex_error(ls,0,LJ_ERR_XBREAK);
            }
            lj_lex_error(ls,0,LJ_ERR_XLUNDEF,uVar4 + 0x18);
          }
          puVar1 = &bl->prev->flags;
          *puVar1 = *puVar1 | (uVar4 != 1) * '\x02' + 2U;
          vl->slot = bl->nactvar;
          if ((bl->flags & 8) != 0) {
            gola_close(ls,vl);
          }
        }
      }
      else {
        (vl->name).gcptr64 = 0;
        for (vg = local_38; vg < pVVar3 + uVar2; vg = vg + 1) {
          if (((vg->name).gcptr64 == uVar4) && ((vg->info & 2) != 0)) {
            if (((bl->flags & 8) != 0) && (vl->slot < vg->slot)) {
              gola_close(ls,vg);
            }
            gola_patch(ls,vg,vl);
          }
        }
      }
    }
    vl = vl + 1;
  } while( true );
}

Assistant:

static void gola_fixup(LexState *ls, FuncScope *bl)
{
  VarInfo *v = ls->vstack + bl->vstart;
  VarInfo *ve = ls->vstack + ls->vtop;
  for (; v < ve; v++) {
    GCstr *name = strref(v->name);
    if (name != NULL) {  /* Only consider remaining valid gotos/labels. */
      if (gola_islabel(v)) {
	VarInfo *vg;
	setgcrefnull(v->name);  /* Invalidate label that goes out of scope. */
	for (vg = v+1; vg < ve; vg++)  /* Resolve pending backward gotos. */
	  if (strref(vg->name) == name && gola_isgoto(vg)) {
	    if ((bl->flags&FSCOPE_UPVAL) && vg->slot > v->slot)
	      gola_close(ls, vg);
	    gola_patch(ls, vg, v);
	  }
      } else if (gola_isgoto(v)) {
	if (bl->prev) {  /* Propagate goto or break to outer scope. */
	  bl->prev->flags |= name == NAME_BREAK ? FSCOPE_BREAK : FSCOPE_GOLA;
	  v->slot = bl->nactvar;
	  if ((bl->flags & FSCOPE_UPVAL))
	    gola_close(ls, v);
	} else {  /* No outer scope: undefined goto label or no loop. */
	  ls->linenumber = ls->fs->bcbase[v->startpc].line;
	  if (name == NAME_BREAK)
	    lj_lex_error(ls, 0, LJ_ERR_XBREAK);
	  else
	    lj_lex_error(ls, 0, LJ_ERR_XLUNDEF, strdata(name));
	}
      }
    }
  }
}